

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_start(proxy_handle *ph)

{
  long *plVar1;
  char *pcVar2;
  uint local_28;
  int local_24;
  int i;
  int ret;
  proxy_priv *priv;
  proxy_handle *ph_local;
  
  plVar1 = (long *)ph->priv;
  for (local_28 = 0; (int)local_28 < (int)plVar1[0x107]; local_28 = local_28 + 1) {
    local_24 = proxy_conn_start((proxy_conn_handle *)(*plVar1 + (long)(int)local_28 * 0x48));
    if (local_24 < 0) {
      pcVar2 = strerror(-local_24);
      proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy connection #%d (%d): %s\n",(ulong)local_28
                ,(ulong)(uint)-local_24,pcVar2);
      goto LAB_00106cba;
    }
  }
  local_28 = 0;
  do {
    if ((int)plVar1[0x107] <= (int)local_28) {
      mutex_lock((mutex_handle *)(plVar1 + 0x10e));
      *(int *)((long)plVar1 + 0x83c) = (int)plVar1[0x107];
      mutex_unlock((mutex_handle *)(plVar1 + 0x10e));
      proxy_update_registration(ph);
      local_24 = registration_service_start
                           ((registration_service_handle *)(plVar1 + 0x111),&ph->conf);
      if (local_24 < 0) {
        pcVar2 = strerror(-local_24);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start registration service (%d): %s\n",
                  (ulong)(uint)-local_24,pcVar2);
LAB_00106c74:
        while (local_28 = local_28 - 1, -1 < (int)local_28) {
          worker_join((worker_handle *)(plVar1[0x103] + (long)(int)local_28 * 0x50 + 0x20));
        }
        local_28 = *(uint *)(plVar1 + 0x107);
LAB_00106cba:
        while (local_28 = local_28 - 1, -1 < (int)local_28) {
          proxy_conn_stop((proxy_conn_handle *)(*plVar1 + (long)(int)local_28 * 0x48));
        }
        ph_local._4_4_ = local_24;
      }
      else {
        ph_local._4_4_ = 0;
      }
      return ph_local._4_4_;
    }
    local_24 = worker_start((worker_handle *)(plVar1[0x103] + (long)(int)local_28 * 0x50 + 0x20));
    if (local_24 < 0) {
      pcVar2 = strerror(-local_24);
      proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy worker #%d (%d): %s\n",(ulong)local_28,
                (ulong)(uint)-local_24,pcVar2);
      goto LAB_00106c74;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int proxy_start(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int ret;
	int i;

	for (i = 0; i < priv->num_clients; i++) {
		ret = proxy_conn_start(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit_early;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		ret = worker_start(&priv->client_workers[i].worker);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit;
		}
	}

	mutex_lock(&priv->usable_clients_mutex);
	priv->usable_clients = priv->num_clients;
	mutex_unlock(&priv->usable_clients_mutex);

	proxy_update_registration(ph);
	ret = registration_service_start(&priv->reg_service, &ph->conf);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to start registration service (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_start_exit;
	}

	return 0;

proxy_start_exit:
	for (i--; i >= 0; i--)
		worker_join(&priv->client_workers[i].worker);

	i = priv->num_clients;

proxy_start_exit_early:
	for (i--; i >= 0; i--)
		proxy_conn_stop(&priv->clients[i]);

	return ret;
}